

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O3

void __thiscall
pobr::imgProcessing::structs::Segment::updatePixels
          (Segment *this,Mat_<cv::Vec<int,_3>_> *segmentedImg,int *segmentID)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  ulong uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  Mat local_80 [96];
  
  cv::Mat::Mat(local_80,((int)this->yMax - (int)this->yMin) + 1,
               ((int)this->xMax - (int)this->xMin) + 1,0x10);
  cv::Mat::operator=(&(this->pixels).super_Mat,local_80);
  cv::Mat::~Mat(local_80);
  uVar6 = this->xMin;
  uVar8 = this->xMax;
  if (uVar8 + 1 != uVar6) {
    uVar5 = this->yMin;
    uVar9 = this->yMax;
    uVar4 = 0;
    do {
      if (uVar9 + 1 != uVar5) {
        lVar3 = uVar4 * 3;
        uVar7 = 0;
        do {
          uVar6 = this->xMin;
          lVar1 = **(long **)&segmentedImg->field_0x48;
          lVar2 = *(long *)&segmentedImg->field_0x10;
          *(undefined1 *)
           (**(long **)&(this->pixels).field_0x48 * uVar7 + *(long *)&(this->pixels).field_0x10 + 1
           + lVar3) = 0;
          *(undefined1 *)
           (**(long **)&(this->pixels).field_0x48 * uVar7 + *(long *)&(this->pixels).field_0x10 + 2
           + lVar3) = 0;
          *(char *)(**(long **)&(this->pixels).field_0x48 * uVar7 +
                    *(long *)&(this->pixels).field_0x10 + lVar3) =
               -(*(int *)(((int)uVar5 + (int)uVar7) * lVar1 + lVar2 +
                         (long)((int)uVar6 + (int)uVar4) * 0xc) == *segmentID);
          uVar7 = uVar7 + 1;
          uVar5 = this->yMin;
          uVar9 = this->yMax;
        } while (uVar7 < (uVar9 - uVar5) + 1);
        uVar6 = this->xMin;
        uVar8 = this->xMax;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (uVar8 - uVar6) + 1);
  }
  return;
}

Assistant:

const void
Segment::updatePixels(const cv::Mat_<cv::Vec3i>& segmentedImg, const int& segmentID)
{
    this->pixels = cv::Mat_<cv::Vec3b>(
        (this->yMax - this->yMin + 1),
        (this->xMax - this->xMin + 1)
    );

    for (int x = 0; x < (this->xMax - this->xMin + 1); x++) {
        for (int y = 0; y < (this->yMax - this->yMin + 1); y++) {
            auto& thisSegmentID = segmentedImg(this->yMin + y, this->xMin + x)[0];

            this->pixels(y, x)[1] = consts::colors::black;
            this->pixels(y, x)[2] = consts::colors::black;

            if (thisSegmentID != segmentID) {
                this->pixels(y, x)[0] = consts::colors::black;
            } else {
                this->pixels(y, x)[0] = consts::colors::white;
            }
        }
    }
}